

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-intermediate.cxx
# Opt level: O1

Parameters * parseCommandLine(Parameters *__return_storage_ptr__,int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  size_type *psVar4;
  pointer pcVar5;
  int argc_00;
  string local_528;
  string local_508;
  int local_4e4;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  string local_460;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argNodesFileName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argSolutionName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argEdgesFileName;
  CmdLine tclap;
  
  (__return_storage_ptr__->edgesFileName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->edgesFileName).field_2;
  (__return_storage_ptr__->edgesFileName)._M_string_length = 0;
  (__return_storage_ptr__->edgesFileName).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->nodesFileName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->nodesFileName).field_2;
  (__return_storage_ptr__->nodesFileName)._M_string_length = 0;
  (__return_storage_ptr__->nodesFileName).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->solutionName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->solutionName).field_2;
  (__return_storage_ptr__->solutionName)._M_string_length = 0;
  (__return_storage_ptr__->solutionName).field_2._M_local_buf[0] = '\0';
  psVar3 = &argNodesFileName.super_Arg._flag._M_string_length;
  argNodesFileName.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argNodesFileName,"track","");
  psVar4 = &argEdgesFileName.super_Arg._flag._M_string_length;
  argEdgesFileName.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argEdgesFileName,"1.0","");
  TCLAP::CmdLine::CmdLine(&tclap,(string *)&argNodesFileName,' ',(string *)&argEdgesFileName,true);
  if (argEdgesFileName.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(argEdgesFileName.super_Arg._vptr_Arg,
                    argEdgesFileName.super_Arg._flag._M_string_length + 1);
  }
  if (argNodesFileName.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argNodesFileName.super_Arg._vptr_Arg,
                    argNodesFileName.super_Arg._flag._M_string_length + 1);
  }
  argEdgesFileName.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argEdgesFileName,"n","");
  psVar3 = &argSolutionName.super_Arg._flag._M_string_length;
  argSolutionName.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argSolutionName,"nodes-file","");
  paVar1 = &local_508.field_2;
  local_508._M_dataplus._M_p = (pointer)paVar1;
  local_4e4 = argc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"nodes information","");
  pcVar5 = (__return_storage_ptr__->nodesFileName)._M_dataplus._M_p;
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_480,pcVar5,
             pcVar5 + (__return_storage_ptr__->nodesFileName)._M_string_length);
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"nodes-file","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argNodesFileName,(string *)&argEdgesFileName,(string *)&argSolutionName,&local_508,
             true,&local_480,&local_528,&tclap.super_CmdLineInterface,(Visitor *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != paVar1) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if (argSolutionName.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argSolutionName.super_Arg._vptr_Arg,
                    argSolutionName.super_Arg._flag._M_string_length + 1);
  }
  if (argEdgesFileName.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(argEdgesFileName.super_Arg._vptr_Arg,
                    argEdgesFileName.super_Arg._flag._M_string_length + 1);
  }
  argSolutionName.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&argSolutionName,"e","");
  local_508._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"edges-file","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"edges information","");
  pcVar5 = (__return_storage_ptr__->edgesFileName)._M_dataplus._M_p;
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a0,pcVar5,
             pcVar5 + (__return_storage_ptr__->edgesFileName)._M_string_length);
  paVar2 = &local_4e0.field_2;
  local_4e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"edges-file","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argEdgesFileName,(string *)&argSolutionName,&local_508,&local_528,true,&local_4a0,
             &local_4e0,&tclap.super_CmdLineInterface,(Visitor *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != paVar1) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if (argSolutionName.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(argSolutionName.super_Arg._vptr_Arg,
                    argSolutionName.super_Arg._flag._M_string_length + 1);
  }
  local_508._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"s","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"solution-name","");
  local_4e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"solution name","");
  pcVar5 = (__return_storage_ptr__->solutionName)._M_dataplus._M_p;
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c0,pcVar5,
             pcVar5 + (__return_storage_ptr__->solutionName)._M_string_length);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"solution-name","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argSolutionName,&local_508,&local_528,&local_4e0,true,&local_4c0,&local_460,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  argc_00 = local_4e4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != paVar1) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  TCLAP::CmdLine::parse(&tclap,argc_00,argv);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->nodesFileName);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->solutionName);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&argSolutionName);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&argEdgesFileName);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&argNodesFileName);
  TCLAP::CmdLine::~CmdLine(&tclap);
  return __return_storage_ptr__;
}

Assistant:

Parameters parseCommandLine(int argc, char** argv)
try
{
    Parameters parameters;

    TCLAP::CmdLine tclap("track", ' ', "1.0");
    TCLAP::ValueArg<string> argNodesFileName("n", "nodes-file", "nodes information", true, parameters.nodesFileName, "nodes-file", tclap);
    TCLAP::ValueArg<string> argEdgesFileName("e", "edges-file", "edges information", true, parameters.edgesFileName, "edges-file", tclap);
    TCLAP::ValueArg<string> argSolutionName("s", "solution-name", "solution name", true, parameters.solutionName, "solution-name", tclap);
    
    tclap.parse(argc, argv);

    parameters.edgesFileName = argEdgesFileName.getValue();
    parameters.nodesFileName = argNodesFileName.getValue();
    parameters.solutionName = argSolutionName.getValue();

    return parameters;
}
catch(TCLAP::ArgException& e)
{
    throw runtime_error(e.error());
}